

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O2

void __thiscall
QueryTests_canDeriveTransactionType_Test::~QueryTests_canDeriveTransactionType_Test
          (QueryTests_canDeriveTransactionType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(QueryTests,canDeriveTransactionType)
{
  database::Query query_create_database = "create database company";
  database::Query query_create_container = "create container company.employee(employee_id integer,employee_name string,employee_status string)";
  database::Query query_insert_into = "insert into company.employee values(employee_id:1,employee_name:chandan,employee_status:fulltime)";
  database::Query query_select_all = "select * from company.employee";
  database::Query query_select_all_with_criteria = "select * from company.employee where employee_status = parttime";
  database::Query query_select_dataset = "select employee_id,employee_name from company.employee";
  database::Query query_select_dataset_with_criteria = "select employee_id,employee_name from company.employee where employee_id = 1";
  database::Query query_update = "update company.employee set employee_status = fulltime where employee_id = 1";
  database::Query query_truncate = "truncate container company.employee";
  /*
  !ALTER CONTAINER  - not implemented
  TODO Need to implement the processing for alter container query
  */
  // database::Query query_alter = "alter container company.employee delete column employee_status";// To Be Adjusted Later

  database::Query query_delete_from = "delete from company.employee where employee_id = 1";
  database::Query query_drop_container = "drop container company.employee";
  database::Query query_drop_database = "drop database company";

  ASSERT_TRUE(query_create_database.transactionType() == database::create_database);
  ASSERT_TRUE(query_create_database.transactionMetaType() == database::ddl);

  ASSERT_TRUE(query_create_container.transactionType() == database::create_container);
  ASSERT_TRUE(query_create_container.transactionMetaType() == database::ddl);

  ASSERT_TRUE(query_insert_into.transactionType() == database::insert_into);
  ASSERT_TRUE(query_insert_into.transactionMetaType() == database::dml);

  ASSERT_TRUE(query_select_all.transactionType() == database::select_all);
  ASSERT_TRUE(query_select_all.transactionMetaType() == database::dml);

  ASSERT_TRUE(query_select_all_with_criteria.transactionType() == database::select_all);
  ASSERT_TRUE(query_select_all_with_criteria.transactionMetaType() == database::dml);

  ASSERT_TRUE(query_select_dataset.transactionType() == database::select_dataset);
  ASSERT_TRUE(query_select_dataset.transactionMetaType() == database::dml);

  ASSERT_TRUE(query_select_dataset_with_criteria.transactionType() == database::select_dataset);
  ASSERT_TRUE(query_select_dataset_with_criteria.transactionMetaType() == database::dml);

  ASSERT_TRUE(query_update.transactionType() == database::update);
  ASSERT_TRUE(query_update.transactionMetaType() == database::dml);

  ASSERT_TRUE(query_truncate.transactionType() == database::truncate);
  ASSERT_TRUE(query_truncate.transactionMetaType() == database::dml);

  ASSERT_TRUE(query_delete_from.transactionType() == database::delete_from);
  ASSERT_TRUE(query_delete_from.transactionMetaType() == database::dml);

  ASSERT_TRUE(query_drop_container.transactionType() == database::drop_container);
  ASSERT_TRUE(query_drop_container.transactionMetaType() == database::ddl);

  ASSERT_TRUE(query_drop_database.transactionType() == database::drop_database);
  ASSERT_TRUE(query_drop_database.transactionMetaType() == database::ddl);
}